

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_inflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGDecompressSettings *settings)

{
  ulong uVar1;
  ushort uVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  uchar *puVar7;
  uint *puVar8;
  uint *bitlen;
  uint *bitlen_00;
  uint *puVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint *puVar15;
  size_t __size;
  uint result_3;
  int iVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  uint result_1;
  int iVar20;
  int iVar21;
  ulong uVar22;
  uint result;
  int iVar23;
  bool bVar24;
  HuffmanTree tree_ll;
  ulong local_118;
  uint *local_110;
  size_t local_100;
  uchar *local_f0;
  ulong local_e0;
  uint local_d4;
  ulong local_c8;
  HuffmanTree local_a8;
  HuffmanTree local_88;
  HuffmanTree local_68;
  ulong local_48;
  uchar **local_40;
  ulong *local_38;
  
  local_f0 = *out;
  local_e0 = *outsize;
  uVar1 = insize * 8;
  uVar14 = 0;
  uVar18 = 0;
  bVar24 = false;
  local_c8 = local_e0;
  local_40 = out;
  local_38 = outsize;
LAB_00106d3f:
  if (bVar24) {
    local_d4 = 0;
    goto LAB_00107ad4;
  }
  uVar6 = uVar14 + 2;
  local_d4 = 0x34;
  if (uVar1 <= uVar6) goto LAB_00107ad4;
  bVar24 = (in[uVar14 >> 3] >> ((uint)uVar14 & 7) & 1) != 0;
  uVar22 = uVar14 + 3;
  bVar4 = (in[uVar6 >> 3] >> ((byte)uVar6 & 7)) * '\x02' & 2 |
          (in[uVar14 + 1 >> 3] >> ((uint)(uVar14 + 1) & 7) & 1) != 0;
  if (bVar4 == 0) {
    uVar5 = (ulong)((uint)uVar22 & 7);
    uVar6 = uVar14 + 4 + (uVar5 ^ 7);
    if (uVar5 == 0) {
      uVar6 = uVar22;
    }
    uVar6 = uVar6 >> 3;
    uVar14 = uVar6 + 4;
    if (insize <= uVar14) goto LAB_00107ad4;
    uVar2 = *(ushort *)(in + uVar6);
    uVar19 = (uint)uVar2;
    uVar12 = (uint)uVar2;
    if (*(ushort *)(in + uVar6 + 2) + uVar12 == 0xffff) {
      uVar6 = uVar12 + uVar18;
      puVar7 = local_f0;
      if (local_c8 < uVar6) {
        uVar22 = local_c8 * 2;
        local_c8 = uVar6 * 3 >> 1;
        if (uVar22 < uVar6) {
          local_c8 = uVar6;
        }
        puVar7 = (uchar *)realloc(local_f0,local_c8);
        if (puVar7 == (uchar *)0x0) {
          local_d4 = 0x53;
          goto LAB_00107ad4;
        }
      }
      local_f0 = puVar7;
      local_e0 = uVar6;
      if (uVar12 + uVar14 <= insize) {
        if (uVar2 != 0) {
          do {
            puVar7 = in + uVar14;
            uVar14 = uVar14 + 1;
            local_f0[uVar18] = *puVar7;
            uVar18 = uVar18 + 1;
            uVar19 = uVar19 - 1;
          } while (uVar19 != 0);
        }
        uVar14 = uVar14 << 3;
        local_d4 = 0;
        goto LAB_0010739e;
      }
      local_d4 = 0x17;
      goto LAB_00107ad4;
    }
    local_d4 = 0x15;
  }
  else {
    if (bVar4 != 3) {
      local_88.tree2d = (uint *)0x0;
      local_88.tree1d = (uint *)0x0;
      local_88.lengths = (uint *)0x0;
      local_a8.tree2d = (uint *)0x0;
      local_a8.tree1d = (uint *)0x0;
      local_a8.lengths = (uint *)0x0;
      if (bVar4 != 2) {
        if (bVar4 == 1) {
          generateFixedLitLenTree(&local_88);
          generateFixedDistanceTree(&local_a8);
          uVar12 = local_88.numcodes;
          puVar8 = local_88.tree2d;
          uVar19 = local_a8.numcodes;
          local_110 = local_a8.tree2d;
        }
        else {
          local_110 = (uint *)0x0;
          uVar12 = local_88.numcodes;
          puVar8 = local_88.tree2d;
          uVar19 = local_a8.numcodes;
        }
        goto LAB_00107018;
      }
      local_118 = uVar14 + 0x11;
      local_d4 = 0x31;
      if (uVar1 < local_118) {
LAB_00106fea:
        local_118 = uVar22;
        local_110 = (uint *)0x0;
        puVar8 = (uint *)0x0;
      }
      else {
        iVar10 = 0;
        iVar21 = 0;
        do {
          iVar17 = iVar21;
          iVar16 = (uint)((in[uVar22 >> 3] >> ((uint)uVar22 & 7) & 1) != 0) << ((byte)iVar10 & 0x1f)
          ;
          iVar21 = iVar16 + iVar17;
          uVar22 = uVar22 + 1;
          iVar10 = iVar10 + 1;
        } while (iVar10 != 5);
        uVar6 = uVar14 + 8;
        iVar10 = 0;
        iVar23 = 0;
        do {
          iVar23 = iVar23 + ((uint)((in[uVar6 >> 3] >> ((uint)uVar6 & 7) & 1) != 0) <<
                            ((byte)iVar10 & 0x1f));
          uVar6 = uVar6 + 1;
          iVar10 = iVar10 + 1;
        } while (iVar10 != 5);
        uVar14 = uVar14 + 0xd;
        iVar10 = 0;
        iVar20 = 0;
        do {
          iVar20 = iVar20 + ((uint)((in[uVar14 >> 3] >> ((uint)uVar14 & 7) & 1) != 0) <<
                            ((byte)iVar10 & 0x1f));
          uVar14 = uVar14 + 1;
          iVar10 = iVar10 + 1;
        } while (iVar10 != 4);
        if (uVar1 < (iVar20 + 4U) * 3 + local_118) {
          local_d4 = 0x32;
          uVar22 = local_118;
          goto LAB_00106fea;
        }
        local_68.tree2d = (uint *)0x0;
        local_68.tree1d = (uint *)0x0;
        local_68.lengths = (uint *)0x0;
        puVar8 = (uint *)malloc(0x4c);
        if (puVar8 == (uint *)0x0) {
          local_110 = (uint *)0x0;
          bitlen = (uint *)0x0;
          bitlen_00 = (uint *)0x0;
          local_d4 = 0x53;
        }
        else {
          uVar12 = iVar21 + 0x101;
          uVar14 = 0;
          do {
            uVar19 = 0;
            if (uVar14 < iVar20 + 4U) {
              iVar10 = 0;
              uVar19 = 0;
              uVar6 = local_118;
              do {
                uVar19 = uVar19 + ((uint)((in[uVar6 >> 3] >> ((uint)uVar6 & 7) & 1) != 0) <<
                                  ((byte)iVar10 & 0x1f));
                uVar6 = uVar6 + 1;
                iVar10 = iVar10 + 1;
              } while (iVar10 != 3);
              local_118 = local_118 + 3;
            }
            puVar8[CLCL_ORDER[uVar14]] = uVar19;
            uVar14 = uVar14 + 1;
          } while (uVar14 != 0x13);
          local_d4 = HuffmanTree_makeFromLengths(&local_68,puVar8,0x13,7);
          if (local_d4 == 0) {
            bitlen = (uint *)malloc(0x480);
            bitlen_00 = (uint *)malloc(0x80);
            if (bitlen_00 == (uint *)0x0 || bitlen == (uint *)0x0) {
              local_110 = (uint *)0x0;
              local_d4 = 0x53;
            }
            else {
              memset(bitlen,0,0x480);
              bitlen_00[0] = 0;
              bitlen_00[1] = 0;
              bitlen_00[2] = 0;
              bitlen_00[3] = 0;
              bitlen_00[4] = 0;
              bitlen_00[5] = 0;
              bitlen_00[6] = 0;
              bitlen_00[7] = 0;
              bitlen_00[8] = 0;
              bitlen_00[9] = 0;
              bitlen_00[10] = 0;
              bitlen_00[0xb] = 0;
              bitlen_00[0xc] = 0;
              bitlen_00[0xd] = 0;
              bitlen_00[0xe] = 0;
              bitlen_00[0xf] = 0;
              bitlen_00[0x10] = 0;
              bitlen_00[0x11] = 0;
              bitlen_00[0x12] = 0;
              bitlen_00[0x13] = 0;
              bitlen_00[0x14] = 0;
              bitlen_00[0x15] = 0;
              bitlen_00[0x16] = 0;
              bitlen_00[0x17] = 0;
              bitlen_00[0x18] = 0;
              bitlen_00[0x19] = 0;
              bitlen_00[0x1a] = 0;
              bitlen_00[0x1b] = 0;
              bitlen_00[0x1c] = 0;
              bitlen_00[0x1d] = 0;
              bitlen_00[0x1e] = 0;
              bitlen_00[0x1f] = 0;
              uVar19 = iVar23 + iVar21 + 0x102U;
              if (uVar19 == 0) {
LAB_0010791a:
                local_d4 = 0x40;
              }
              else {
                uVar14 = (ulong)uVar12;
                local_48 = (ulong)uVar19;
                iVar10 = -0x101 - (iVar16 + iVar17);
                local_d4 = 0;
                uVar11 = 0;
                do {
                  uVar13 = 0;
                  uVar6 = local_118;
LAB_001075b4:
                  if (uVar1 <= uVar6) {
                    uVar6 = local_118;
                    if (local_118 <= uVar1) {
                      uVar6 = uVar1;
                    }
                    goto LAB_00107938;
                  }
                  uVar3 = local_68.tree2d
                          [(uint)((in[uVar6 >> 3] >> ((uint)uVar6 & 7) & 1) != 0) + uVar13 * 2];
                  uVar13 = uVar3 - local_68.numcodes;
                  if (local_68.numcodes <= uVar3) goto code_r0x001075ea;
                  uVar22 = uVar6 + 1;
                  if (uVar3 < 0x10) {
                    puVar15 = bitlen_00;
                    uVar13 = uVar12;
                    if (uVar11 < uVar12) {
                      puVar15 = bitlen;
                      uVar13 = 0;
                    }
                    puVar15[uVar11 - uVar13] = uVar3;
                    uVar11 = uVar11 + 1;
                    local_118 = uVar22;
                  }
                  else if (uVar3 == 0x12) {
                    if (uVar1 < uVar6 + 8) {
LAB_001079f7:
                      local_d4 = 0x32;
                      goto LAB_00107a47;
                    }
                    local_118 = uVar6 + 8;
                    iVar16 = 0;
                    iVar17 = 0;
                    do {
                      iVar17 = iVar17 + ((uint)((in[uVar22 >> 3] >> ((uint)uVar22 & 7) & 1) != 0) <<
                                        ((byte)iVar16 & 0x1f));
                      uVar22 = uVar22 + 1;
                      iVar16 = iVar16 + 1;
                    } while (iVar16 != 7);
                    iVar17 = iVar17 + 0xb;
                    if (iVar17 != 0) {
                      uVar6 = (ulong)uVar11;
                      iVar16 = -uVar11;
                      puVar15 = bitlen + uVar6;
                      do {
                        if (local_48 <= uVar6) {
                          uVar11 = -iVar16;
                          local_d4 = 0xf;
                          goto LAB_0010788a;
                        }
                        puVar9 = bitlen_00 + (uint)(iVar10 + (int)uVar6);
                        if (uVar6 < uVar14) {
                          puVar9 = puVar15;
                        }
                        *puVar9 = 0;
                        uVar6 = uVar6 + 1;
                        iVar16 = iVar16 + -1;
                        puVar15 = puVar15 + 1;
                        iVar17 = iVar17 + -1;
                      } while (iVar17 != 0);
LAB_0010784c:
                      uVar11 = -iVar16;
                    }
                  }
                  else {
                    if (uVar3 != 0x11) {
                      if (uVar3 == 0x10) {
                        if (uVar11 != 0) {
                          if (uVar6 + 3 <= uVar1) {
                            local_118 = uVar6 + 3;
                            iVar16 = 0;
                            iVar17 = 0;
                            do {
                              iVar17 = iVar17 + ((uint)((in[uVar22 >> 3] >> ((uint)uVar22 & 7) & 1)
                                                       != 0) << ((byte)iVar16 & 0x1f));
                              uVar22 = uVar22 + 1;
                              iVar16 = iVar16 + 1;
                            } while (iVar16 != 2);
                            puVar15 = bitlen_00 + ((uVar11 - iVar21) - 0x102);
                            if (uVar11 < iVar21 + 0x102U) {
                              puVar15 = bitlen + (uVar11 - 1);
                            }
                            iVar17 = iVar17 + 3;
                            if (iVar17 != 0) {
                              uVar13 = *puVar15;
                              uVar6 = (ulong)uVar11;
                              iVar16 = -uVar11;
                              puVar15 = bitlen + uVar6;
                              do {
                                if (local_48 <= uVar6) {
                                  uVar11 = -iVar16;
                                  local_d4 = 0xd;
                                  goto LAB_0010788a;
                                }
                                puVar9 = bitlen_00 + (uint)(iVar10 + (int)uVar6);
                                if (uVar6 < uVar14) {
                                  puVar9 = puVar15;
                                }
                                *puVar9 = uVar13;
                                uVar6 = uVar6 + 1;
                                iVar16 = iVar16 + -1;
                                puVar15 = puVar15 + 1;
                                iVar17 = iVar17 + -1;
                              } while (iVar17 != 0);
                              goto LAB_0010784c;
                            }
                            goto LAB_0010788a;
                          }
                          goto LAB_001079f7;
                        }
                        local_d4 = 0x36;
                      }
                      else {
                        local_d4 = 0x10;
                      }
LAB_00107a47:
                      local_118 = uVar6 + 1;
                      goto LAB_00107958;
                    }
                    if (uVar1 < uVar6 + 4) goto LAB_001079f7;
                    local_118 = uVar6 + 4;
                    iVar16 = 0;
                    iVar17 = 0;
                    do {
                      iVar17 = iVar17 + ((uint)((in[uVar22 >> 3] >> ((uint)uVar22 & 7) & 1) != 0) <<
                                        ((byte)iVar16 & 0x1f));
                      uVar22 = uVar22 + 1;
                      iVar16 = iVar16 + 1;
                    } while (iVar16 != 3);
                    iVar17 = iVar17 + 3;
                    if (iVar17 != 0) {
                      uVar6 = (ulong)uVar11;
                      iVar16 = -uVar11;
                      puVar15 = bitlen + uVar6;
                      do {
                        if (local_48 <= uVar6) {
                          uVar11 = -iVar16;
                          local_d4 = 0xe;
                          goto LAB_0010788a;
                        }
                        puVar9 = bitlen_00 + (uint)(iVar10 + (int)uVar6);
                        if (uVar6 < uVar14) {
                          puVar9 = puVar15;
                        }
                        *puVar9 = 0;
                        uVar6 = uVar6 + 1;
                        iVar16 = iVar16 + -1;
                        puVar15 = puVar15 + 1;
                        iVar17 = iVar17 + -1;
                      } while (iVar17 != 0);
                      goto LAB_0010784c;
                    }
                  }
LAB_0010788a:
                } while (uVar11 < uVar19);
                if (local_d4 == 0) {
                  if (bitlen[0x100] == 0) goto LAB_0010791a;
                  local_d4 = HuffmanTree_makeFromLengths(&local_88,bitlen,0x120,0xf);
                  if (local_d4 == 0) {
                    local_d4 = HuffmanTree_makeFromLengths(&local_a8,bitlen_00,0x20,0xf);
                    local_110 = local_a8.tree2d;
                    goto LAB_0010795d;
                  }
                }
              }
LAB_00107958:
              local_110 = (uint *)0x0;
            }
          }
          else {
            local_110 = (uint *)0x0;
            bitlen = (uint *)0x0;
            bitlen_00 = (uint *)0x0;
          }
        }
LAB_0010795d:
        free(puVar8);
        free(bitlen);
        free(bitlen_00);
        free(local_68.tree2d);
        free(local_68.tree1d);
        free(local_68.lengths);
        puVar8 = local_88.tree2d;
        uVar22 = local_118;
        uVar12 = local_88.numcodes;
        uVar19 = local_a8.numcodes;
        if (local_d4 == 0) {
LAB_00107018:
          while( true ) {
            uVar11 = 0;
            local_118 = uVar22;
            while( true ) {
              uVar14 = local_118;
              if (uVar1 <= uVar14) {
                local_118 = uVar22;
                if (uVar22 <= uVar1) {
                  local_118 = uVar1;
                }
                goto LAB_0010732f;
              }
              uVar13 = puVar8[(uint)((in[uVar14 >> 3] >> ((uint)uVar14 & 7) & 1) != 0) + uVar11 * 2]
              ;
              local_118 = uVar14 + 1;
              uVar11 = uVar13 - uVar12;
              if (uVar13 < uVar12) break;
              if (uVar12 <= uVar11) {
                local_118 = uVar14 + 1;
                goto LAB_0010732f;
              }
            }
            uVar22 = uVar14 + 1;
            if (uVar13 < 0x100) break;
            if ((uVar13 == 0x100) || (0x11d < uVar13)) {
              local_118 = uVar14 + 1;
              local_d4 = 0;
              if (uVar13 != 0x100) {
LAB_0010732f:
                local_d4 = 0xb - (uVar1 < local_118);
              }
              goto LAB_0010733f;
            }
            uVar6 = (ulong)(uVar13 - 0x101);
            if (uVar1 < LENGTHEXTRA[uVar6] + uVar14 + 1) {
              local_118 = uVar14 + 1;
              local_d4 = 0x33;
              goto LAB_0010733f;
            }
            if (uVar6 - 0x1c < 0xffffffffffffffec) {
              uVar14 = 0;
            }
            else {
              uVar13 = 0;
              uVar11 = 0;
              do {
                uVar11 = uVar11 + ((uint)((in[uVar22 >> 3] >> ((uint)uVar22 & 7) & 1) != 0) <<
                                  ((byte)uVar13 & 0x1f));
                uVar22 = uVar22 + 1;
                uVar13 = uVar13 + 1;
              } while (LENGTHEXTRA[uVar6] != uVar13);
              uVar14 = (ulong)uVar11;
            }
            uVar14 = LENGTHBASE[uVar6] + uVar14;
            uVar11 = 0;
            uVar6 = uVar22;
            while( true ) {
              if (uVar1 <= uVar6) {
                local_118 = uVar22;
                if (uVar22 <= uVar1) {
                  local_118 = uVar1;
                }
                local_d4 = 0x12;
                goto LAB_0010733f;
              }
              uVar11 = local_110[(uint)((in[uVar6 >> 3] >> ((uint)uVar6 & 7) & 1) != 0) + uVar11 * 2
                                ];
              local_118 = uVar6 + 1;
              if (uVar11 < uVar19) break;
              uVar11 = uVar11 - uVar19;
              uVar6 = local_118;
              if (uVar19 <= uVar11) goto LAB_001074a6;
            }
            if (0x1d < uVar11) {
LAB_001074a6:
              local_d4 = 0x12;
              goto LAB_0010733f;
            }
            if (uVar1 < DISTANCEEXTRA[uVar11] + uVar6 + 1) {
              local_118 = uVar6 + 1;
              local_d4 = 0x33;
              goto LAB_0010733f;
            }
            local_118 = uVar6 + 1;
            iVar21 = 0;
            if (3 < uVar11) {
              uVar13 = 0;
              iVar21 = 0;
              do {
                iVar21 = iVar21 + ((uint)((in[local_118 >> 3] >> ((uint)local_118 & 7) & 1) != 0) <<
                                  ((byte)uVar13 & 0x1f));
                local_118 = local_118 + 1;
                uVar13 = uVar13 + 1;
              } while (DISTANCEEXTRA[uVar11] != uVar13);
            }
            uVar6 = (ulong)(iVar21 + DISTANCEBASE[uVar11]);
            if (uVar18 < uVar6) {
              local_d4 = 0x34;
              goto LAB_0010733f;
            }
            uVar5 = uVar14 + uVar18;
            if (local_c8 < uVar5) {
              local_100 = uVar5 * 3 >> 1;
              if (local_c8 * 2 < uVar5) {
                local_100 = uVar5;
              }
              puVar7 = (uchar *)realloc(local_f0,local_100);
              if (puVar7 == (uchar *)0x0) {
                local_d4 = 0x53;
                goto LAB_0010733f;
              }
            }
            else {
              local_100 = local_c8;
              puVar7 = local_f0;
            }
            local_f0 = puVar7;
            if (uVar6 < uVar14) {
              do {
                local_f0[uVar18] = local_f0[uVar18 - uVar6];
                uVar18 = uVar18 + 1;
                uVar14 = uVar14 - 1;
              } while (uVar14 != 0);
            }
            else {
              memcpy(local_f0 + uVar18,local_f0 + (uVar18 - uVar6),uVar14);
              uVar18 = uVar5;
            }
            local_c8 = local_100;
            uVar22 = local_118;
            local_e0 = uVar5;
          }
          uVar14 = uVar18 + 1;
          __size = local_c8;
          puVar7 = local_f0;
          if (local_c8 < uVar14) {
            __size = uVar14 * 3 >> 1;
            if (local_c8 * 2 < uVar14) {
              __size = uVar14;
            }
            puVar7 = (uchar *)realloc(local_f0,__size);
            if (puVar7 == (uchar *)0x0) goto LAB_001079c1;
          }
          local_f0 = puVar7;
          local_f0[uVar18] = (uchar)uVar13;
          uVar18 = uVar14;
          local_e0 = uVar14;
          local_c8 = __size;
          goto LAB_00107018;
        }
      }
      goto LAB_0010733f;
    }
    local_d4 = 0x14;
  }
  goto LAB_00107ad4;
code_r0x001075ea:
  uVar6 = uVar6 + 1;
  if (local_68.numcodes <= uVar13) {
LAB_00107938:
    local_d4 = 0xb - (uVar1 < uVar6);
    local_118 = uVar6;
    goto LAB_00107958;
  }
  goto LAB_001075b4;
LAB_001079c1:
  local_d4 = 0x53;
LAB_0010733f:
  free(puVar8);
  free(local_88.tree1d);
  free(local_88.lengths);
  free(local_110);
  free(local_a8.tree1d);
  free(local_a8.lengths);
  uVar14 = local_118;
LAB_0010739e:
  if (local_d4 != 0) {
LAB_00107ad4:
    *local_40 = local_f0;
    *local_38 = local_e0;
    return local_d4;
  }
  goto LAB_00106d3f;
}

Assistant:

unsigned lodepng_inflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGDecompressSettings* settings)
{
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_inflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}